

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O2

uint lodepng::getChunks(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *names,vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *chunks,vector<unsigned_char,_std::allocator<unsigned_char>_> *png)

{
  long lVar1;
  bool bVar2;
  uchar *__last;
  pointer puVar3;
  long lVar4;
  pointer chunk;
  allocator_type local_89;
  uchar *local_88;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_78;
  char type [5];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  string name;
  
  local_88 = (png->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  puVar3 = (png->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start + 8;
  lVar4 = 0;
  chunk = puVar3;
  local_80 = chunks;
  local_78 = names;
  while( true ) {
    if (local_88 <= chunk + 8) {
      return 0;
    }
    if (chunk < puVar3) {
      return 0;
    }
    lodepng_chunk_type(type,chunk);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,type,(allocator<char> *)&local_68);
    if ((name._M_string_length != 4) || (__last = lodepng_chunk_next_const(chunk), __last <= chunk))
    break;
    bVar2 = std::operator==(&name,"IHDR");
    lVar1 = 0;
    if (!bVar2) {
      bVar2 = std::operator==(&name,"PLTE");
      lVar1 = 1;
      if (!bVar2) {
        bVar2 = std::operator==(&name,"IDAT");
        lVar1 = 2;
        if (!bVar2) {
          bVar2 = std::operator==(&name,"IEND");
          if (bVar2) {
            std::__cxx11::string::~string((string *)&name);
            return 0;
          }
          if (local_88 < __last) break;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_78 + lVar4,&name);
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<unsigned_char_const*,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_68,chunk,__last,
                     &local_89);
          std::
          vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      *)(local_80 + lVar4),
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68)
          ;
          lVar1 = lVar4;
        }
      }
    }
    lVar4 = lVar1;
    std::__cxx11::string::~string((string *)&name);
    chunk = __last;
  }
  std::__cxx11::string::~string((string *)&name);
  return 1;
}

Assistant:

unsigned getChunks(std::vector<std::string> names[3],
                   std::vector<std::vector<unsigned char> > chunks[3],
                   const std::vector<unsigned char>& png) {
  const unsigned char *chunk, *next, *begin, *end;
  end = &png.back() + 1;
  begin = chunk = &png.front() + 8;

  int location = 0;

  while(chunk + 8 < end && chunk >= begin) {
    char type[5];
    lodepng_chunk_type(type, chunk);
    std::string name(type);
    if(name.size() != 4) return 1;

    next = lodepng_chunk_next_const(chunk);
    if (next <= chunk) return 1; // integer overflow

    if(name == "IHDR") {
      location = 0;
    } else if(name == "PLTE") {
      location = 1;
    } else if(name == "IDAT") {
      location = 2;
    } else if(name == "IEND") {
      break; // anything after IEND is not part of the PNG or the 3 groups here.
    } else {
      if(next > end) return 1; // invalid chunk, content too far
      names[location].push_back(name);
      chunks[location].push_back(std::vector<unsigned char>(chunk, next));
    }

    chunk = next;
  }
  return 0;
}